

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

byte * __thiscall
Memory::LargeHeapBlock::GetRealAddressFromInterior(LargeHeapBlock *this,void *interiorAddress)

{
  LargeObjectHeader *pLVar1;
  undefined4 *puVar2;
  LargeObjectHeader *header;
  code *pcVar3;
  bool bVar4;
  ulong uVar5;
  undefined8 *in_FS_OFFSET;
  
  puVar2 = (undefined4 *)*in_FS_OFFSET;
  uVar5 = 0;
  do {
    if (this->allocCount <= uVar5) {
      return (byte *)0x0;
    }
    header = (LargeObjectHeader *)(&this[1].super_HeapBlock._vptr_HeapBlock)[uVar5];
    if ((header != (LargeObjectHeader *)0x0) && (bVar4 = IsPartialSweptHeader(this,header), !bVar4))
    {
      if (uVar5 != header->objectIndex) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar2 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x3ca,"(header->objectIndex == i)","header->objectIndex == i");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar2 = 0;
      }
      pLVar1 = header + 1;
      if ((pLVar1 <= interiorAddress) &&
         (interiorAddress < (void *)((long)&pLVar1->objectIndex + header->objectSize))) {
        return (byte *)pLVar1;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

byte *
LargeHeapBlock::GetRealAddressFromInterior(void * interiorAddress)
{
    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader * header = this->HeaderList()[i];

#if ENABLE_PARTIAL_GC && ENABLE_CONCURRENT_GC
        if (header != nullptr && !IsPartialSweptHeader(header))
#else
        if (header != nullptr)
#endif
        {
            Assert(header->objectIndex == i);
            byte * startAddress = (byte *)header->GetAddress();
            if (startAddress <= interiorAddress && (startAddress + header->objectSize > interiorAddress))
            {
                return startAddress;
            }
        }
    }

    return nullptr;
}